

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O2

void get_unshared_pnodes(Parser *p,PNode *x,PNode *y,VecPNode *pvx,VecPNode *pvy)

{
  uint32 *puVar1;
  uint uVar2;
  PNode *pPVar3;
  PNode **ppPVar4;
  PNode **ppPVar5;
  VecPNode *v;
  VecPNode *v_00;
  int iVar6;
  PNode *pPVar7;
  PNode *pPVar8;
  ulong uVar9;
  VecPNode sx;
  VecPNode hy;
  VecPNode hx;
  VecPNode local_e0;
  VecPNode local_b8;
  VecPNode *local_90;
  VecPNode *local_88;
  VecPNode local_80;
  VecPNode local_58;
  
  local_58.n = 0;
  local_58.v = (PNode **)0x0;
  local_80.n = 0;
  local_80.v = (PNode **)0x0;
  local_e0.n = 0;
  local_e0.v = (PNode **)0x0;
  local_b8.n = 0;
  local_b8.v = (PNode **)0x0;
  pPVar7 = x->latest;
  local_90 = pvx;
  local_88 = pvy;
  while (pPVar8 = pPVar7->latest, pPVar7 != pPVar8) {
    pPVar8->refcount = pPVar8->refcount + 1;
    puVar1 = &pPVar7->refcount;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      free_PNode(p,pPVar7);
    }
    x->latest = pPVar8;
    pPVar7 = pPVar8;
  }
  pPVar8 = y->latest;
  while (pPVar3 = pPVar8->latest, pPVar8 != pPVar3) {
    pPVar3->refcount = pPVar3->refcount + 1;
    puVar1 = &pPVar8->refcount;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      free_PNode(p,pPVar8);
    }
    y->latest = pPVar3;
    pPVar8 = pPVar3;
  }
  set_add(&local_e0,pPVar7);
  set_add(&local_b8,pPVar8);
  while (v_00 = local_88, v = local_90, pPVar7 != (PNode *)0x0 || pPVar8 != (PNode *)0x0) {
    if ((pPVar8 == (PNode *)0x0) || ((pPVar7 != (PNode *)0x0 && (pPVar8->height < pPVar7->height))))
    {
      get_children(p,pPVar7,&local_e0,&local_b8,&local_58);
      pPVar7 = heap_pop(&local_58);
    }
    else {
      get_children(p,pPVar8,&local_b8,&local_e0,&local_80);
      pPVar8 = heap_pop(&local_80);
    }
  }
  ppPVar5 = local_90->e;
  for (uVar9 = 0; uVar9 < local_e0.n; uVar9 = uVar9 + 1) {
    if (local_e0.v[uVar9] != (PNode *)0x0) {
      iVar6 = set_find(&local_b8,local_e0.v[uVar9]);
      if (iVar6 == 0) {
        ppPVar4 = v->v;
        if (ppPVar4 == (PNode **)0x0) {
          pPVar7 = local_e0.v[uVar9];
          v->v = ppPVar5;
          uVar2 = v->n;
          v->n = uVar2 + 1;
          v->e[uVar2] = pPVar7;
        }
        else {
          uVar2 = v->n;
          if (ppPVar4 == ppPVar5) {
            if (2 < uVar2) goto LAB_0014285d;
            pPVar7 = local_e0.v[uVar9];
          }
          else {
            if ((uVar2 & 7) == 0) {
LAB_0014285d:
              vec_add_internal(v,local_e0.v[uVar9]);
              goto LAB_001427f8;
            }
            pPVar7 = local_e0.v[uVar9];
          }
          v->n = uVar2 + 1;
          ppPVar4[uVar2] = pPVar7;
        }
      }
    }
LAB_001427f8:
  }
  uVar9 = 0;
  do {
    if (local_b8.n <= uVar9) {
      if (local_58.v != local_58.e && local_58.v != (PNode **)0x0) {
        free(local_58.v);
      }
      local_58.n = 0;
      local_58.v = (PNode **)0x0;
      if (local_80.v != local_80.e && local_80.v != (PNode **)0x0) {
        free(local_80.v);
      }
      local_80.n = 0;
      local_80.v = (PNode **)0x0;
      if (local_e0.v != local_e0.e && local_e0.v != (PNode **)0x0) {
        free(local_e0.v);
      }
      local_e0.n = 0;
      local_e0.v = (PNode **)0x0;
      if (local_b8.v != local_b8.e && local_b8.v != (PNode **)0x0) {
        free(local_b8.v);
      }
      return;
    }
    if (local_b8.v[uVar9] != (PNode *)0x0) {
      iVar6 = set_find(&local_e0,local_b8.v[uVar9]);
      if (iVar6 == 0) {
        ppPVar5 = v_00->v;
        if (ppPVar5 == (PNode **)0x0) {
          pPVar7 = local_b8.v[uVar9];
          v_00->v = v_00->e;
          uVar2 = v_00->n;
          v_00->n = uVar2 + 1;
          v_00->e[uVar2] = pPVar7;
        }
        else {
          uVar2 = v_00->n;
          if (ppPVar5 == v_00->e) {
            if (2 < uVar2) goto LAB_0014290b;
            pPVar7 = local_b8.v[uVar9];
          }
          else {
            if ((uVar2 & 7) == 0) {
LAB_0014290b:
              vec_add_internal(v_00,local_b8.v[uVar9]);
              goto LAB_001428a4;
            }
            pPVar7 = local_b8.v[uVar9];
          }
          v_00->n = uVar2 + 1;
          ppPVar5[uVar2] = pPVar7;
        }
      }
    }
LAB_001428a4:
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

static void get_unshared_pnodes(Parser *p, PNode *x, PNode *y, VecPNode *pvx, VecPNode *pvy) {
  uint i;
  VecPNode hx, hy, sx, sy;
  vec_clear(&hx);
  vec_clear(&hy);
  vec_clear(&sx);
  vec_clear(&sy);
  LATEST(p, x);
  LATEST(p, y);
  set_add(&sx, x);
  set_add(&sy, y);
  while (1) {
    if (!x && !y) break;
    if (!y || (x && x->height > y->height)) {
      get_children(p, x, &sx, &sy, &hx);
      x = heap_pop(&hx);
    } else {
      get_children(p, y, &sy, &sx, &hy);
      y = heap_pop(&hy);
    }
  }
  for (i = 0; i < sx.n; i++)
    if (sx.v[i] && !set_find(&sy, sx.v[i])) vec_add(pvx, sx.v[i]);
  for (i = 0; i < sy.n; i++)
    if (sy.v[i] && !set_find(&sx, sy.v[i])) vec_add(pvy, sy.v[i]);
  vec_free(&hx);
  vec_free(&hy);
  vec_free(&sx);
  vec_free(&sy);
}